

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void testing::internal::
     SharedPayload<testing::internal::EqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
     ::Destroy(SharedPayloadBase *shared)

{
  void *pvVar1;
  
  if ((shared != (SharedPayloadBase *)0x0) &&
     (pvVar1 = *(void **)(shared + 2), pvVar1 != (void *)0x0)) {
    operator_delete(pvVar1,*(long *)(shared + 6) - (long)pvVar1);
  }
  operator_delete(shared,0x20);
  return;
}

Assistant:

static void Destroy(SharedPayloadBase* shared) {
    delete static_cast<SharedPayload*>(shared);
  }